

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * google::protobuf::internal::GetPrototypeForWeakDescriptor
                    (DescriptorTable *table,int index,bool force_build)

{
  int iVar1;
  DescriptorPool *this;
  Descriptor *pDVar2;
  MessageFactory *pMVar3;
  undefined4 extraout_var;
  Descriptor *descriptor;
  FileDescriptor *local_30;
  FileDescriptor *file;
  Message *msg;
  bool force_build_local;
  DescriptorTable *pDStack_18;
  int index_local;
  DescriptorTable *table_local;
  
  msg._3_1_ = force_build;
  msg._4_4_ = index;
  pDStack_18 = table;
  InitProtobufDefaults();
  file = (FileDescriptor *)pDStack_18->default_instances[msg._4_4_];
  table_local = (DescriptorTable *)file;
  if (file == (FileDescriptor *)0x0) {
    if ((msg._3_1_ & 1) == 0) {
      table_local = (DescriptorTable *)0x0;
    }
    else {
      AssignDescriptors(pDStack_18);
      this = DescriptorPool::internal_generated_pool();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&descriptor,
                 pDStack_18->filename);
      local_30 = DescriptorPool::FindFileByName(this,_descriptor);
      pDVar2 = cpp::
               VisitDescriptorsInFileOrder<google::protobuf::internal::GetPrototypeForWeakDescriptor(google::protobuf::internal::DescriptorTable_const*,int,bool)::__0>
                         (local_30,(int *)((long)&msg + 4));
      pMVar3 = MessageFactory::generated_factory();
      iVar1 = (*pMVar3->_vptr_MessageFactory[2])(pMVar3,pDVar2);
      table_local = (DescriptorTable *)CONCAT44(extraout_var,iVar1);
    }
  }
  return (Message *)table_local;
}

Assistant:

const Message* GetPrototypeForWeakDescriptor(const DescriptorTable* table,
                                             int index, bool force_build) {
  // First, make sure we inject the surviving default instances.
  InitProtobufDefaults();

  // Now check if the table has it. If so, return it.
  if (const auto* msg = table->default_instances[index]) {
    return msg;
  }

  if (!force_build) {
    return nullptr;
  }

  // Fallback to dynamic messages.
  // Register the dep and generate the prototype via the generated pool.
  AssignDescriptors(table);

  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);

  const Descriptor* descriptor = internal::cpp::VisitDescriptorsInFileOrder(
      file, [&](auto* desc) -> const Descriptor* {
        if (index == 0) return desc;
        --index;
        return nullptr;
      });

  return MessageFactory::generated_factory()->GetPrototype(descriptor);
}